

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O0

int pk_get_pk_alg(uchar **p,uchar *end,mbedtls_pk_type_t *pk_alg,mbedtls_asn1_buf *params)

{
  int iVar1;
  undefined1 local_50 [8];
  mbedtls_asn1_buf alg_oid;
  int ret;
  mbedtls_asn1_buf *params_local;
  mbedtls_pk_type_t *pk_alg_local;
  uchar *end_local;
  uchar **p_local;
  
  memset(params,0,0x18);
  alg_oid.p._4_4_ = mbedtls_asn1_get_alg(p,end,(mbedtls_asn1_buf *)local_50,params);
  if (alg_oid.p._4_4_ == 0) {
    iVar1 = mbedtls_oid_get_pk_alg((mbedtls_asn1_buf *)local_50,pk_alg);
    if (iVar1 == 0) {
      if ((*pk_alg == MBEDTLS_PK_RSA) &&
         (((params->tag != 5 && (params->tag != 0)) || (params->len != 0)))) {
        p_local._4_4_ = -0x3a80;
      }
      else {
        p_local._4_4_ = 0;
      }
    }
    else {
      p_local._4_4_ = -0x3c80;
    }
  }
  else {
    p_local._4_4_ = alg_oid.p._4_4_ + -0x3a80;
  }
  return p_local._4_4_;
}

Assistant:

static int pk_get_pk_alg( unsigned char **p,
                          const unsigned char *end,
                          mbedtls_pk_type_t *pk_alg, mbedtls_asn1_buf *params )
{
    int ret;
    mbedtls_asn1_buf alg_oid;

    memset( params, 0, sizeof(mbedtls_asn1_buf) );

    if( ( ret = mbedtls_asn1_get_alg( p, end, &alg_oid, params ) ) != 0 )
        return( MBEDTLS_ERR_PK_INVALID_ALG + ret );

    if( mbedtls_oid_get_pk_alg( &alg_oid, pk_alg ) != 0 )
        return( MBEDTLS_ERR_PK_UNKNOWN_PK_ALG );

    /*
     * No parameters with RSA (only for EC)
     */
    if( *pk_alg == MBEDTLS_PK_RSA &&
            ( ( params->tag != MBEDTLS_ASN1_NULL && params->tag != 0 ) ||
                params->len != 0 ) )
    {
        return( MBEDTLS_ERR_PK_INVALID_ALG );
    }

    return( 0 );
}